

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufdwatch.c
# Opt level: O3

void fd_watch_thread_func(_AL_THREAD *self,void *unused)

{
  pthread_mutex_t *__mutex;
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  uint *puVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  timeval tv;
  fd_set rfds;
  timeval local_c8;
  fd_set local_b8;
  
  __mutex = &self->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  _Var1 = self->should_stop;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (_Var1 == false) {
    do {
      if (fd_watch_mutex.inited == true) {
        pthread_mutex_lock((pthread_mutex_t *)&fd_watch_mutex.mutex);
      }
      local_b8.fds_bits[0xe] = 0;
      local_b8.fds_bits[0xf] = 0;
      local_b8.fds_bits[0xc] = 0;
      local_b8.fds_bits[0xd] = 0;
      local_b8.fds_bits[10] = 0;
      local_b8.fds_bits[0xb] = 0;
      local_b8.fds_bits[8] = 0;
      local_b8.fds_bits[9] = 0;
      local_b8.fds_bits[6] = 0;
      local_b8.fds_bits[7] = 0;
      local_b8.fds_bits[4] = 0;
      local_b8.fds_bits[5] = 0;
      local_b8.fds_bits[2] = 0;
      local_b8.fds_bits[3] = 0;
      local_b8.fds_bits[0] = 0;
      local_b8.fds_bits[1] = 0;
      if (fd_watch_list._size == 0) {
        iVar8 = 0;
      }
      else {
        uVar9 = 0;
        iVar8 = -1;
        do {
          piVar4 = (int *)_al_vector_ref(&fd_watch_list,(uint)uVar9);
          iVar2 = *piVar4;
          iVar6 = iVar2 + 0x3f;
          if (-1 < iVar2) {
            iVar6 = iVar2;
          }
          local_b8.fds_bits[iVar6 >> 6] = local_b8.fds_bits[iVar6 >> 6] | 1L << ((byte)iVar2 & 0x3f)
          ;
          if (iVar8 < iVar2) {
            iVar8 = iVar2;
          }
          uVar9 = (ulong)((uint)uVar9 + 1);
        } while (uVar9 < fd_watch_list._size);
        iVar8 = iVar8 + 1;
      }
      if (fd_watch_mutex.inited == true) {
        pthread_mutex_unlock((pthread_mutex_t *)&fd_watch_mutex.mutex);
      }
      local_c8.tv_sec = 0;
      local_c8.tv_usec = 250000;
      iVar8 = select(iVar8,&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_c8);
      if (0 < iVar8) {
        if (fd_watch_mutex.inited == true) {
          pthread_mutex_lock((pthread_mutex_t *)&fd_watch_mutex.mutex);
        }
        if (fd_watch_list._size != 0) {
          uVar9 = 0;
          do {
            puVar5 = (uint *)_al_vector_ref(&fd_watch_list,(uint)uVar9);
            uVar3 = *puVar5;
            uVar7 = uVar3 + 0x3f;
            if (-1 < (int)uVar3) {
              uVar7 = uVar3;
            }
            if (((ulong)local_b8.fds_bits[(int)uVar7 >> 6] >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
              (**(code **)(puVar5 + 2))(*(undefined8 *)(puVar5 + 4));
            }
            uVar9 = (ulong)((uint)uVar9 + 1);
          } while (uVar9 < fd_watch_list._size);
        }
        if (fd_watch_mutex.inited == true) {
          pthread_mutex_unlock((pthread_mutex_t *)&fd_watch_mutex.mutex);
        }
      }
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      _Var1 = self->should_stop;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    } while (_Var1 != true);
  }
  return;
}

Assistant:

static void fd_watch_thread_func(_AL_THREAD *self, void *unused)
{
   (void)unused;

   while (!_al_get_thread_should_stop(self)) {

      fd_set rfds;
      int max_fd;

      /* set up max_fd and rfds */
      _al_mutex_lock(&fd_watch_mutex);
      {
         WATCH_ITEM *wi;
         unsigned int i;

         FD_ZERO(&rfds);
         max_fd = -1;

         for (i = 0; i < _al_vector_size(&fd_watch_list); i++) {
            wi = _al_vector_ref(&fd_watch_list, i);
            FD_SET(wi->fd, &rfds);
            if (wi->fd > max_fd)
               max_fd = wi->fd;
         }
      }
      _al_mutex_unlock(&fd_watch_mutex);

      /* wait for something to happen on one of the fds */
      {
         struct timeval tv;
         int retval;

         tv.tv_sec = 0;
         tv.tv_usec = 250000;

         retval = select(max_fd+1, &rfds, NULL, NULL, &tv);
         if (retval < 1)
            continue;
      }

      /* one or more of the fds has activity */
      _al_mutex_lock(&fd_watch_mutex);
      {
         WATCH_ITEM *wi;
         unsigned int i;

         for (i = 0; i < _al_vector_size(&fd_watch_list); i++) {
            wi = _al_vector_ref(&fd_watch_list, i);
            if (FD_ISSET(wi->fd, &rfds)) {
               /* The callback is allowed to modify the watch list so the mutex
                * must be recursive.
                */
               wi->callback(wi->cb_data);
            }
         }
      }
      _al_mutex_unlock(&fd_watch_mutex);
   }
}